

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::CollationSettings::setMaxVariable
          (CollationSettings *this,int32_t value,int32_t defaultOptions,UErrorCode *errorCode)

{
  uint uVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if ((uint)value < 4) {
    uVar1 = value << 4;
  }
  else {
    if (value != -1) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    uVar1 = defaultOptions & 0x70;
  }
  this->options = this->options & 0xffffff8fU | uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }